

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONConfigurePresets.cxx
# Opt level: O0

bool anon_unknown.dwarf_4f80d7::TraceOutputFormatHelper
               (optional<cmTraceEnums::TraceOutputFormat> *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  TraceOutputFormat local_8c;
  ValueHolder local_88;
  String local_80;
  TraceOutputFormat local_5c;
  ValueHolder local_58;
  String local_50;
  cmJSONState *local_28;
  cmJSONState *state_local;
  Value *value_local;
  optional<cmTraceEnums::TraceOutputFormat> *out_local;
  
  local_28 = state;
  state_local = (cmJSONState *)value;
  value_local = (Value *)out;
  if (value == (Value *)0x0) {
    std::optional<cmTraceEnums::TraceOutputFormat>::operator=(out);
    out_local._7_1_ = true;
  }
  else {
    bVar1 = Json::Value::isString(value);
    if (bVar1) {
      Json::Value::asString_abi_cxx11_(&local_50,(Value *)state_local);
      bVar1 = std::operator==(&local_50,"human");
      std::__cxx11::string::~string((string *)&local_50);
      if (bVar1) {
        local_5c = Human;
        std::optional<cmTraceEnums::TraceOutputFormat>::
        optional<cmTraceEnums::TraceOutputFormat,_true>
                  ((optional<cmTraceEnums::TraceOutputFormat> *)&local_58,&local_5c);
        value_local->value_ = local_58;
      }
      else {
        Json::Value::asString_abi_cxx11_(&local_80,(Value *)state_local);
        bVar1 = std::operator==(&local_80,"json-v1");
        std::__cxx11::string::~string((string *)&local_80);
        if (!bVar1) {
          cmCMakePresetsErrors::INVALID_PRESET((Value *)state_local,local_28);
          return false;
        }
        local_8c = JSONv1;
        std::optional<cmTraceEnums::TraceOutputFormat>::
        optional<cmTraceEnums::TraceOutputFormat,_true>
                  ((optional<cmTraceEnums::TraceOutputFormat> *)&local_88,&local_8c);
        value_local->value_ = local_88;
      }
      out_local._7_1_ = true;
    }
    else {
      cmCMakePresetsErrors::INVALID_PRESET((Value *)state_local,local_28);
      out_local._7_1_ = false;
    }
  }
  return out_local._7_1_;
}

Assistant:

bool TraceOutputFormatHelper(cm::optional<TraceOutputFormat>& out,
                             const Json::Value* value, cmJSONState* state)
{
  if (!value) {
    out = cm::nullopt;
    return true;
  }

  if (!value->isString()) {
    cmCMakePresetsErrors::INVALID_PRESET(value, state);
    return false;
  }

  if (value->asString() == "human") {
    out = TraceOutputFormat::Human;
  } else if (value->asString() == "json-v1") {
    out = TraceOutputFormat::JSONv1;
  } else {
    cmCMakePresetsErrors::INVALID_PRESET(value, state);
    return false;
  }

  return true;
}